

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O2

bool __thiscall Memory::Recycler::HasPendingTrackObjects(Recycler *this)

{
  bool bVar1;
  
  bVar1 = MarkContext::HasPendingTrackObjects(&this->markContext);
  if (!bVar1) {
    bVar1 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext1);
    if (!bVar1) {
      bVar1 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext2);
      if (!bVar1) {
        bVar1 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext3);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool HasPendingTrackObjects() const { return markContext.HasPendingTrackObjects() || parallelMarkContext1.HasPendingTrackObjects() || parallelMarkContext2.HasPendingTrackObjects() || parallelMarkContext3.HasPendingTrackObjects(); }